

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_dev_t ggml_backend_dev_by_type(ggml_backend_dev_type type)

{
  int iVar1;
  size_t sVar2;
  int in_EDI;
  ggml_backend_dev_t dev;
  size_t i;
  ggml_backend_dev_t in_stack_ffffffffffffffe0;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = ggml_backend_dev_count();
    if (sVar2 <= local_18) {
      return (ggml_backend_dev_t)0x0;
    }
    in_stack_ffffffffffffffe0 = ggml_backend_dev_get((size_t)in_stack_ffffffffffffffe0);
    iVar1 = ggml_backend_dev_type(in_stack_ffffffffffffffe0);
    if (iVar1 == in_EDI) break;
    local_18 = local_18 + 1;
  }
  return in_stack_ffffffffffffffe0;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_by_type(enum ggml_backend_dev_type type) {
    for (size_t i = 0; i < ggml_backend_dev_count(); i++) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);
        if (ggml_backend_dev_type(dev) == type) {
            return dev;
        }
    }
    return nullptr;
}